

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::pkgConfigFileName
          (QString *__return_storage_ptr__,MakefileGenerator *this,bool fixify)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  bool bVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98 [2];
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_98,"QMAKE_PKGCONFIG_FILE");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
  ProString::toQString(__return_storage_ptr__,&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_98);
  if ((__return_storage_ptr__->d).size == 0) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)local_98,"TARGET");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
    ProString::toQString((QString *)&local_b8,&local_68);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_b8.d;
    (__return_storage_ptr__->d).ptr = local_b8.ptr;
    qVar6 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_b8.size;
    local_b8.d = pDVar2;
    local_b8.ptr = pcVar3;
    local_b8.size = qVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_98);
    qVar6 = QString::lastIndexOf(__return_storage_ptr__,&Option::dir_sep,CaseSensitive);
    if ((int)qVar6 != -1) {
      QString::right(&local_68.m_string,__return_storage_ptr__,
                     ~(long)(int)qVar6 + (__return_storage_ptr__->d).size);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.m_string.d.size;
      local_68.m_string.d.d = pDVar2;
      local_68.m_string.d.ptr = pcVar3;
      local_68.m_string.d.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    QString::QString(&local_68.m_string,"lib");
    cVar4 = QString::startsWith((QString *)__return_storage_ptr__,(CaseSensitivity)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (cVar4 != '\0') {
      QString::mid((longlong)&local_68,(longlong)__return_storage_ptr__);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.m_string.d.size;
      local_68.m_string.d.d = pDVar2;
      local_68.m_string.d.ptr = pcVar3;
      local_68.m_string.d.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    qVar6 = QString::indexOf(__return_storage_ptr__,(QChar)0x2e,0,CaseSensitive);
    if ((int)qVar6 != -1) {
      QString::left(&local_68.m_string,__return_storage_ptr__,(long)(int)qVar6);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar3 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.m_string.d.d;
      (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.m_string.d.size;
      local_68.m_string.d.d = pDVar2;
      local_68.m_string.d.ptr = pcVar3;
      local_68.m_string.d.size = qVar6;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
  }
  QString::append((QString *)__return_storage_ptr__);
  local_b8.size = -0x5555555555555556;
  local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_98,"QMAKE_PKGCONFIG_DESTDIR");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
  ProString::toQString((QString *)&local_b8,&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_98);
  if (local_b8.size != 0) {
    cVar4 = QString::endsWith((QString *)&local_b8,0x26bbd0);
    if (cVar4 == '\0') {
      QString::prepend(__return_storage_ptr__,&Option::dir_sep);
    }
    QString::prepend(__return_storage_ptr__,(QString *)&local_b8);
  }
  if (fixify) {
    cVar4 = QDir::isRelativePath((QString *)__return_storage_ptr__);
    if (cVar4 != '\0') {
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)&local_68,"DESTDIR");
      bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      if (!bVar5) {
        pQVar1 = this->project;
        ProKey::ProKey((ProKey *)local_98,"DESTDIR");
        QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
        ProString::toQString((QString *)&local_d0,&local_68);
        QString::prepend(__return_storage_ptr__,(QString *)&local_d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(local_98);
      }
    }
    fileFixify(&local_68.m_string,this,__return_storage_ptr__,(FileFixifyTypes)0x3,true);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_68.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_68.m_string.d.ptr;
    qVar6 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_68.m_string.d.size;
    local_68.m_string.d.d = pDVar2;
    local_68.m_string.d.ptr = pcVar3;
    local_68.m_string.d.size = qVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::pkgConfigFileName(bool fixify)
{
    QString ret = project->first("QMAKE_PKGCONFIG_FILE").toQString();
    if (ret.isEmpty()) {
        ret = project->first("TARGET").toQString();
        int slsh = ret.lastIndexOf(Option::dir_sep);
        if (slsh != -1)
            ret = ret.right(ret.size() - slsh - 1);
        if (ret.startsWith("lib"))
            ret = ret.mid(3);
        int dot = ret.indexOf('.');
        if (dot != -1)
            ret = ret.left(dot);
    }
    ret += Option::pkgcfg_ext;
    QString subdir = project->first("QMAKE_PKGCONFIG_DESTDIR").toQString();
    if(!subdir.isEmpty()) {
        // initOutPaths() appends dir_sep, but just to be safe..
        if (!subdir.endsWith(Option::dir_sep))
            ret.prepend(Option::dir_sep);
        ret.prepend(subdir);
    }
    if(fixify) {
        if(QDir::isRelativePath(ret) && !project->isEmpty("DESTDIR"))
            ret.prepend(project->first("DESTDIR").toQString());
        ret = fileFixify(ret, FileFixifyBackwards);
    }
    return ret;
}